

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void exprstat(LexState *ls)

{
  uint *puVar1;
  Instruction *inst;
  LHS_assign v;
  FuncState *fs;
  LexState *ls_local;
  
  v.v._16_8_ = ls->fs;
  suffixedexp(ls,(expdesc *)&v);
  if (((ls->t).token == 0x3d) || ((ls->t).token == 0x2c)) {
    inst = (Instruction *)0x0;
    restassign(ls,(LHS_assign *)&inst,1);
  }
  else {
    if ((int)v.prev != 0x12) {
      luaX_syntaxerror(ls,"syntax error");
    }
    puVar1 = (uint *)(*(long *)(*(long *)v.v._16_8_ + 0x40) + (long)(int)v.v.k * 4);
    *puVar1 = *puVar1 & 0xffffff | 0x1000000;
  }
  return;
}

Assistant:

static void exprstat (LexState *ls) {
  /* stat -> func | assignment */
  FuncState *fs = ls->fs;
  struct LHS_assign v;
  suffixedexp(ls, &v.v);
  if (ls->t.token == '=' || ls->t.token == ',') { /* stat -> assignment ? */
    v.prev = NULL;
    restassign(ls, &v, 1);
  }
  else {  /* stat -> func */
    Instruction *inst;
    check_condition(ls, v.v.k == VCALL, "syntax error");
    inst = &getinstruction(fs, &v.v);
    SETARG_C(*inst, 1);  /* call statement uses no results */
  }
}